

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O2

void __thiscall
spvtools::opt::analysis::DebugInfoManager::AnalyzeDebugInsts(DebugInfoManager *this,Module *module)

{
  Instruction *pIVar1;
  bool bVar2;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  this->deref_operation_ = (Instruction *)0x0;
  this->debug_info_none_inst_ = (Instruction *)0x0;
  this->empty_debug_expr_inst_ = (Instruction *)0x0;
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp:829:22)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp:829:22)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  Module::ForEachInst(module,(function<void_(spvtools::opt::Instruction_*)> *)&local_30,false);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  if (((this->empty_debug_expr_inst_ != (Instruction *)0x0) &&
      (pIVar1 = (this->empty_debug_expr_inst_->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                previous_node_, pIVar1 != (Instruction *)0x0)) &&
     ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    bVar2 = Instruction::IsCommonDebugInstr(pIVar1);
    if (bVar2) {
      utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
                (&this->empty_debug_expr_inst_->super_IntrusiveNodeBase<spvtools::opt::Instruction>,
                 *(Instruction **)
                  ((long)&((this->context_->module_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                          ext_inst_debuginfo_ + 0x10));
    }
  }
  if (((this->debug_info_none_inst_ != (Instruction *)0x0) &&
      (pIVar1 = (this->debug_info_none_inst_->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                previous_node_, pIVar1 != (Instruction *)0x0)) &&
     ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    bVar2 = Instruction::IsCommonDebugInstr(pIVar1);
    if (bVar2) {
      utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
                (&this->debug_info_none_inst_->super_IntrusiveNodeBase<spvtools::opt::Instruction>,
                 *(Instruction **)
                  ((long)&((this->context_->module_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                          ext_inst_debuginfo_ + 0x10));
    }
  }
  return;
}

Assistant:

void DebugInfoManager::AnalyzeDebugInsts(Module& module) {
  deref_operation_ = nullptr;
  debug_info_none_inst_ = nullptr;
  empty_debug_expr_inst_ = nullptr;
  module.ForEachInst([this](Instruction* cpi) { AnalyzeDebugInst(cpi); });

  // Move |empty_debug_expr_inst_| to the beginning of the debug instruction
  // list.
  if (empty_debug_expr_inst_ != nullptr &&
      empty_debug_expr_inst_->PreviousNode() != nullptr &&
      empty_debug_expr_inst_->PreviousNode()->IsCommonDebugInstr()) {
    empty_debug_expr_inst_->InsertBefore(
        &*context()->module()->ext_inst_debuginfo_begin());
  }

  // Move |debug_info_none_inst_| to the beginning of the debug instruction
  // list.
  if (debug_info_none_inst_ != nullptr &&
      debug_info_none_inst_->PreviousNode() != nullptr &&
      debug_info_none_inst_->PreviousNode()->IsCommonDebugInstr()) {
    debug_info_none_inst_->InsertBefore(
        &*context()->module()->ext_inst_debuginfo_begin());
  }
}